

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::NetworkHttpClient> *this,void *pointer)

{
  _Link_type __x;
  
  if (pointer != (void *)0x0) {
    __x = (_Link_type)pointer;
    TaskSet::~TaskSet((TaskSet *)((long)pointer + 0xc0));
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_erase(*(_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 **)((long)pointer + 0xa0),__x);
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_erase(*(_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 **)((long)pointer + 0x70),__x);
  }
  operator_delete(pointer,0xf8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }